

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.hpp
# Opt level: O3

void tcmalloc::ThreadCache::DeleteCache(ThreadCache *cache)

{
  ThreadCache *pTVar1;
  ThreadCache *pTVar2;
  int iVar3;
  long in_FS_OFFSET;
  
  Clear(cache);
  *(undefined8 *)(in_FS_OFFSET + -8) = 0;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)global_lock);
  if (iVar3 == 0) {
    pTVar1 = cache->next;
    if (next_cache_steal == cache) {
      next_cache_steal = pTVar1;
    }
    pTVar2 = cache->prev;
    pTVar2->next = pTVar1;
    pTVar1->prev = pTVar2;
    cache->prev = (ThreadCache *)0x0;
    cache->next = (ThreadCache *)0x0;
    cache_list_size = cache_list_size + -1;
    unclaimed_cache_space = unclaimed_cache_space + cache->max_size_;
    if (thread_cache_allocator[0x18] != '\0') {
      cache->size_ = thread_cache_allocator._16_8_;
      thread_cache_allocator._16_8_ = cache;
      pthread_mutex_unlock((pthread_mutex_t *)global_lock);
      return;
    }
  }
  else {
    std::__throw_system_error(iVar3);
  }
  __assert_fail("inited",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/fixed_allocator.hpp"
                ,0x22,
                "void tcmalloc::FixedAllocator<tcmalloc::ThreadCache>::Free(T *) [T = tcmalloc::ThreadCache]"
               );
}

Assistant:

static void DeleteCache(ThreadCache* cache) {
        cache->Clear();
        tls_cache = nullptr;
        global_lock.lock();
        if (next_cache_steal == cache) {
            next_cache_steal = cache->next;
        }
        CacheListRemove(cache);
        unclaimed_cache_space += cache->max_size_;
        thread_cache_allocator.Free(cache);
        global_lock.unlock();
    }